

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O1

void __thiscall
t_netstd_generator::generate_service_helpers
          (t_netstd_generator *this,ostream *out,t_service *tservice)

{
  int *piVar1;
  t_struct *tstruct;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  pointer pptVar4;
  pointer pptVar5;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string local_68;
  vector<t_function_*,_std::allocator<t_function_*>_> local_48;
  
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&local_48,&tservice->functions_);
  iVar2 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
  prepare_member_name_mapping
            (this,tservice,&tservice->functions_,(string *)CONCAT44(extraout_var,iVar2));
  t_generator::indent_abi_cxx11_(&local_68,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_68._M_dataplus._M_p,local_68._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"public class InternalStructs",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_68,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_68._M_dataplus._M_p,local_68._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  for (pptVar4 = local_48.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pptVar4 !=
      local_48.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
    tstruct = (*pptVar4)->arglist_;
    for (pptVar5 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar5 !=
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
      collect_extensions_types(this,(*pptVar5)->type_);
    }
    generate_netstd_struct_definition(this,out,tstruct,false,true,false);
    generate_function_helpers(this,out,*pptVar4);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_68,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_68._M_dataplus._M_p,local_68._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  cleanup_member_name_mapping(this,tservice);
  if (local_48.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void t_netstd_generator::generate_service_helpers(ostream& out, t_service* tservice)
{
    vector<t_function*> functions = tservice->get_functions();
    vector<t_function*>::iterator f_iter;

    prepare_member_name_mapping(tservice);
    out << indent() << "public class InternalStructs" << endl;
    out << indent() << "{" << endl;
    indent_up();

    for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter)
    {
        t_struct* ts = (*f_iter)->get_arglist();
        collect_extensions_types(ts);
        generate_netstd_struct_definition(out, ts, false, true);
        generate_function_helpers(out, *f_iter);
    }

    indent_down();
    out << indent() << "}" << endl << endl;
    cleanup_member_name_mapping(tservice);
}